

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::writeSequentialContainer<QList<QWidgetItemData>>
          (QDataStream *s,QList<QWidgetItemData> *c)

{
  bool bVar1;
  const_iterator o;
  QList<QWidgetItemData> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  value_type *t;
  QList<QWidgetItemData> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  QWidgetItemData *in_stack_ffffffffffffffa8;
  QDataStream *out;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  out = in_RDI;
  QList<QWidgetItemData>::size(in_RSI);
  bVar1 = QDataStream::writeQSizeType((QDataStream *)in_stack_ffffffffffffffa8,0x8aebc1);
  if (bVar1) {
    local_10.i = (QWidgetItemData *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QWidgetItemData>::begin((QList<QWidgetItemData> *)out);
    o = QList<QWidgetItemData>::end((QList<QWidgetItemData> *)out);
    while (bVar1 = QList<QWidgetItemData>::const_iterator::operator!=(&local_10,o), bVar1) {
      QList<QWidgetItemData>::const_iterator::operator*(&local_10);
      ::operator<<(out,in_stack_ffffffffffffffa8);
      QList<QWidgetItemData>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}